

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int planandnavigatexythetalat
              (PlannerType plannerType,char *envCfgFilename,char *motPrimFilename,bool forwardSearch
              )

{
  EnvNAVXYTHETALAT_InitParms EVar1;
  pointer piVar2;
  pointer piVar3;
  double dVar4;
  double dVar5;
  char cVar6;
  byte bVar7;
  byte bVar8;
  undefined4 uVar9;
  void *__s;
  anaPlanner *this;
  long lVar10;
  ostream *poVar11;
  long *plVar12;
  long lVar13;
  FILE *__stream;
  undefined4 extraout_var;
  clock_t cVar14;
  clock_t cVar15;
  runtime_error *prVar16;
  undefined7 in_register_00000009;
  long lVar17;
  vector *pvVar18;
  char *pcVar19;
  ulong uVar20;
  ulong uVar21;
  int y;
  int iVar22;
  int iVar23;
  long lVar24;
  int *piVar25;
  undefined8 *puVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  char *pcVar30;
  uint uVar31;
  bool bVar32;
  bool bVar33;
  double dVar34;
  undefined1 auVar35 [16];
  sbpl_2Dcell_t sVar36;
  undefined1 auVar37 [16];
  undefined8 in_stack_fffffffffffff9a8;
  undefined8 uVar38;
  double *pdVar39;
  double *pdVar40;
  double *pdVar41;
  double *pdVar42;
  double *pdVar43;
  double *pdVar44;
  double *pdVar45;
  vector *pvVar46;
  vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_> *pvVar47;
  int newtheta;
  int size_x;
  int newy;
  int newx;
  int size_y;
  uchar obsthresh;
  int local_5dc;
  sbpl_2Dcell_t local_5d8;
  long lStack_5d0;
  ulong local_5c0;
  int num_thetas;
  double starty;
  double startx;
  double starttheta;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> perimeterptsV;
  vector<int,_std::allocator<int>_> solution_stateIDs_V;
  double cellsize_m;
  double goaltheta;
  double goaly;
  double goalx;
  uint local_530;
  uint local_52c;
  vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> xythetaPath;
  vector<int,_std::allocator<int>_> preds_of_changededgesIDV;
  sbpl_2Dpt_t local_4e8;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> changedcellsV;
  sbpl_2Dcell_t local_4b0;
  uint local_4a4;
  uint local_4a0;
  uint local_49c;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> sensecells;
  MDPConfig MDPCfg;
  double timetoturn45degsinplace_secs;
  double nominalvel_mpersecs;
  vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_> motionprimitiveV;
  EnvironmentNAVXYTHETALAT environment_navxythetalat;
  EnvironmentNAVXYTHETALAT trueenvironment_navxythetalat;
  int local_88 [2];
  void *local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  bVar8 = 0;
  local_5dc = (int)CONCAT71(in_register_00000009,forwardSearch);
  local_5c0 = CONCAT44(local_5c0._4_4_,plannerType);
  EnvironmentNAVXYTHETALATTICE::EnvironmentNAVXYTHETALATTICE
            ((EnvironmentNAVXYTHETALATTICE *)&environment_navxythetalat);
  _environment_navxythetalat = operator_delete__;
  EnvironmentNAVXYTHETALATTICE::EnvironmentNAVXYTHETALATTICE
            ((EnvironmentNAVXYTHETALATTICE *)&trueenvironment_navxythetalat);
  _trueenvironment_navxythetalat = operator_delete__;
  perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4e8.x = -0.01;
  local_4e8.y = -0.01;
  std::vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>>::_M_realloc_insert<sbpl_2Dpt_t_const&>
            ((vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>> *)&perimeterptsV,(iterator)0x0,
             &local_4e8);
  local_4e8.x = 0.01;
  local_4e8.y = -0.01;
  if (perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>>::_M_realloc_insert<sbpl_2Dpt_t_const&>
              ((vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>> *)&perimeterptsV,
               (iterator)
               perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_4e8);
  }
  else {
    (perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
     super__Vector_impl_data._M_finish)->x = 0.01;
    (perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
     super__Vector_impl_data._M_finish)->y = -0.01;
    perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
    super__Vector_impl_data._M_finish =
         perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_4e8.x = 0.01;
  local_4e8.y = 0.01;
  if (perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>>::_M_realloc_insert<sbpl_2Dpt_t_const&>
              ((vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>> *)&perimeterptsV,
               (iterator)
               perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_4e8);
  }
  else {
    (perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
     super__Vector_impl_data._M_finish)->x = 0.01;
    (perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
     super__Vector_impl_data._M_finish)->y = 0.01;
    perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
    super__Vector_impl_data._M_finish =
         perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_4e8.x = -0.01;
  local_4e8.y = 0.01;
  if (perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>>::_M_realloc_insert<sbpl_2Dpt_t_const&>
              ((vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>> *)&perimeterptsV,
               (iterator)
               perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_4e8);
  }
  else {
    (perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
     super__Vector_impl_data._M_finish)->x = -0.01;
    (perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
     super__Vector_impl_data._M_finish)->y = 0.01;
    perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
    super__Vector_impl_data._M_finish =
         perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  cVar6 = EnvironmentNAVXYTHETALATTICE::InitializeEnv((char *)&trueenvironment_navxythetalat);
  local_5d8 = (sbpl_2Dcell_t)motPrimFilename;
  if (cVar6 == '\0') {
    prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar16,"ERROR: InitializeEnv failed");
    *(undefined ***)prVar16 = &PTR__runtime_error_0010ec48;
    __cxa_throw(prVar16,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  size_x = -1;
  size_y = -1;
  num_thetas = -1;
  startx = -1.0;
  starty = -1.0;
  pdVar39 = &starttheta;
  starttheta = -1.0;
  pdVar40 = &goalx;
  goalx = -1.0;
  pdVar41 = &goaly;
  goaly = -1.0;
  pdVar42 = &goaltheta;
  goaltheta = -1.0;
  pdVar43 = &cellsize_m;
  cellsize_m = 0.0;
  pdVar44 = &nominalvel_mpersecs;
  nominalvel_mpersecs = 0.0;
  pdVar45 = &timetoturn45degsinplace_secs;
  timetoturn45degsinplace_secs = 0.0;
  pvVar46 = (vector *)&obsthresh;
  obsthresh = '\0';
  pvVar47 = &motionprimitiveV;
  motionprimitiveV.
  super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  motionprimitiveV.
  super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  motionprimitiveV.
  super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar38 = 0x1083cc;
  EnvironmentNAVXYTHETALATTICE::GetEnvParms
            ((int *)&trueenvironment_navxythetalat,&size_x,&size_y,(double *)&num_thetas,&startx,
             &starty,pdVar39,pdVar40,pdVar41,pdVar42,pdVar43,pdVar44,(uchar *)pdVar45,pvVar46);
  EnvironmentNAVXYTHETALATTICE::GetEnvParameter((char *)&trueenvironment_navxythetalat);
  EnvironmentNAVXYTHETALATTICE::GetEnvParameter((char *)&trueenvironment_navxythetalat);
  puts("true map:");
  if (0 < size_y) {
    iVar28 = 0;
    do {
      if (0 < size_x) {
        iVar22 = 0;
        do {
          bVar7 = EnvironmentNAVXYTHETALATTICE::GetMapCost
                            ((int)&trueenvironment_navxythetalat,iVar22);
          printf("%3d ",(ulong)bVar7);
          iVar22 = iVar22 + 1;
        } while (iVar22 < size_x);
      }
      putchar(10);
      iVar28 = iVar28 + 1;
    } while (iVar28 < size_y);
  }
  system("pause");
  printf("System Pause (return=%d)\n");
  uVar20 = (long)size_y * (long)size_x;
  __s = operator_new__(uVar20);
  if (0 < (int)uVar20) {
    memset(__s,0,uVar20 & 0xffffffff);
  }
  printf("start: %f %f %f, goal: %f %f %f\n",startx,starty,starttheta,SUB84(goalx,0),goaly,goaltheta
        );
  cVar6 = EnvironmentNAVXYTHETALATTICE::SetEnvParameter((char *)&environment_navxythetalat,0x10b6df)
  ;
  if (cVar6 == '\0') {
    prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar16,"ERROR: failed to set parameters");
LAB_001095e9:
    *(undefined ***)prVar16 = &PTR__runtime_error_0010ec48;
    __cxa_throw(prVar16,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  cVar6 = EnvironmentNAVXYTHETALATTICE::SetEnvParameter((char *)&environment_navxythetalat,0x10b6f5)
  ;
  dVar5 = nominalvel_mpersecs;
  dVar4 = timetoturn45degsinplace_secs;
  dVar34 = cellsize_m;
  iVar28 = size_x;
  if (cVar6 == '\0') {
    prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar16,"ERROR: failed to set parameters");
    goto LAB_001095e9;
  }
  pvVar18 = (vector *)(ulong)(uint)size_y;
  pcVar19 = (char *)(ulong)obsthresh;
  local_88[0] = num_thetas;
  local_80 = __s;
  local_78 = startx;
  local_70 = starty;
  local_68 = starttheta;
  local_60 = goalx;
  local_58 = goaly;
  local_50 = goaltheta;
  local_48 = 0x3f50624dd2f1a9fc;
  uStack_40 = 0x3f50624dd2f1a9fc;
  local_38 = 0x3f50624dd2f1a9fc;
  piVar25 = local_88;
  puVar26 = (undefined8 *)&stack0xfffffffffffff9a8;
  for (lVar17 = 0xb; lVar17 != 0; lVar17 = lVar17 + -1) {
    *puVar26 = *(undefined8 *)piVar25;
    piVar25 = piVar25 + ((ulong)bVar8 * -2 + 1) * 2;
    puVar26 = puVar26 + (ulong)bVar8 * -2 + 1;
  }
  EVar1.mapdata = (uchar *)uVar38;
  EVar1._0_8_ = in_stack_fffffffffffff9a8;
  EVar1.startx = (double)pdVar39;
  EVar1.starty = (double)pdVar40;
  EVar1.starttheta = (double)pdVar41;
  EVar1.goalx = (double)pdVar42;
  EVar1.goaly = (double)pdVar43;
  EVar1.goaltheta = (double)pdVar44;
  EVar1.goaltol_x = (double)pdVar45;
  EVar1.goaltol_y = (double)pvVar46;
  EVar1.goaltol_theta = (double)pvVar47;
  cVar6 = EnvironmentNAVXYTHETALATTICE::InitializeEnv
                    ((int)&environment_navxythetalat,iVar28,pvVar18,dVar34,dVar5,dVar4,
                     (uchar)&perimeterptsV,pcVar19,EVar1);
  if (cVar6 == '\0') {
    prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar16,"ERROR: InitializeEnv failed");
    *(undefined ***)prVar16 = &PTR__runtime_error_0010ec48;
    __cxa_throw(prVar16,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  EnvironmentNAVXYTHETALAT::SetStart(startx,starty,starttheta);
  EnvironmentNAVXYTHETALAT::SetGoal(goalx,goaly,goaltheta);
  cVar6 = EnvironmentNAVXYTHETALATTICE::InitializeMDPCfg((MDPConfig *)&environment_navxythetalat);
  if (cVar6 == '\0') {
    prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar16,"ERROR: InitializeMDPCfg failed");
    *(undefined ***)prVar16 = &PTR__runtime_error_0010ec48;
    __cxa_throw(prVar16,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  switch(local_5c0 & 0xffffffff) {
  case 0:
    puts("Initializing ADPlanner...");
    this = (anaPlanner *)operator_new(0x98);
    ADPlanner::ADPlanner
              ((ADPlanner *)this,(DiscreteSpaceInformation *)&environment_navxythetalat,
               local_5dc._0_1_);
    break;
  case 1:
    puts("Initializing ARAPlanner...");
    this = (anaPlanner *)operator_new(0xa0);
    ARAPlanner::ARAPlanner
              ((ARAPlanner *)this,(DiscreteSpaceInformation *)&environment_navxythetalat,
               local_5dc._0_1_);
    break;
  default:
    puts("Invalid planner type");
    this = (anaPlanner *)0x0;
    break;
  case 3:
    puts("Invalid configuration: xytheta environment does not support rstar planner...");
    iVar28 = 0;
    goto LAB_0010945b;
  case 5:
    puts("Initializing anaPlanner...");
    this = (anaPlanner *)operator_new(0x48);
    anaPlanner::anaPlanner
              (this,(DiscreteSpaceInformation *)&environment_navxythetalat,local_5dc._0_1_);
  }
  iVar28 = (**(code **)(*(long *)this + 0x28))(this,MDPCfg.startstateid);
  if (iVar28 == 0) {
    prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar16,"ERROR: failed to set start state");
  }
  else {
    iVar28 = (**(code **)(*(long *)this + 0x20))(this,MDPCfg.goalstateid);
    if (iVar28 != 0) {
      (**(code **)(*(long *)this + 0x90))(0x4008000000000000,this);
      (**(code **)(*(long *)this + 0x40))(this,0);
      sensecells.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      sensecells.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      sensecells.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar10 = EnvironmentNAVXYTHETALATTICE::GetEnvNavConfig();
      lVar17 = *(long *)(lVar10 + 0xd8);
      lVar13 = *(long *)(lVar10 + 0xe0);
      pcVar19 = (char *)((lVar13 - lVar17 >> 3) * 0x6db6db6db6db6db7);
      local_5d8.x = 0;
      local_5d8.y = 0;
      if (0 < (int)pcVar19) {
        lVar24 = 0x10;
        pcVar30 = (char *)0x0;
        do {
          if (pcVar19 <= pcVar30) goto LAB_001094db;
          iVar28 = *(int *)(lVar17 + -4 + lVar24);
          iVar22 = *(int *)(lVar17 + lVar24);
          sVar36 = (sbpl_2Dcell_t)(double)(iVar22 * iVar22 + iVar28 * iVar28);
          if ((double)local_5d8 < (double)sVar36) {
            local_5d8 = sVar36;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Found a longer motion primitive with dx = ",0x2a);
            poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar28);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," and dy = ",10);
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar22);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," from starttheta = ",0x13);
            plVar12 = (long *)std::ostream::operator<<
                                        (poVar11,(uint)*(byte *)(lVar17 + -0xc + lVar24));
            std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
            std::ostream::put((char)plVar12);
            std::ostream::flush();
            lVar17 = *(long *)(lVar10 + 0xd8);
            lVar13 = *(long *)(lVar10 + 0xe0);
          }
          pcVar30 = pcVar30 + 1;
          pcVar19 = (char *)((lVar13 - lVar17 >> 3) * 0x6db6db6db6db6db7);
          lVar24 = lVar24 + 0x38;
        } while ((long)pcVar30 < (long)(int)pcVar19);
      }
      if ((double)local_5d8 < 0.0) {
        local_5d8 = (sbpl_2Dcell_t)sqrt((double)local_5d8);
      }
      else {
        local_5d8 = (sbpl_2Dcell_t)SQRT((double)local_5d8);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Maximum motion primitive length: ",0x21);
      poVar11 = std::ostream::_M_insert<double>((double)local_5d8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      dVar34 = ceil((double)local_5d8);
      local_5d8.x = (int)dVar34;
      local_5d8.y = 0;
      if (-1 < local_5d8.x) {
        iVar22 = -local_5d8.x;
        local_5c0 = CONCAT44(local_5c0._4_4_,local_5d8.x * 2 + 1);
        iVar28 = iVar22;
        do {
          iVar27 = (int)local_5c0;
          iVar23 = iVar22;
          do {
            preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)CONCAT44(iVar23,iVar28);
            std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::emplace_back<sbpl_2Dcell_t>
                      (&sensecells,(sbpl_2Dcell_t *)&preds_of_changededgesIDV);
            iVar23 = iVar23 + 1;
            iVar27 = iVar27 + -1;
          } while (iVar27 != 0);
          bVar32 = iVar28 != local_5d8.x;
          iVar28 = iVar28 + 1;
        } while (bVar32);
      }
      __stream = fopen("sol.txt","w");
      if (__stream == (FILE *)0x0) {
        prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar16,"ERROR: could not open solution file");
        *(undefined ***)prVar16 = &PTR__runtime_error_0010ec48;
        __cxa_throw(prVar16,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar29 = (int)(goalx / cellsize_m) - (uint)(goalx < 0.0);
      pcVar30 = (char *)(ulong)uVar29;
      uVar31 = (int)(goaly / cellsize_m) - (uint)(goaly < 0.0);
      ContTheta2Disc(goaltheta,num_thetas);
      printf("goal_c: %d %d %d\n",pcVar30,(ulong)uVar31);
      preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_4b0.x = 0;
      local_4b0.y = 0;
      xythetaPath.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      xythetaPath.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      xythetaPath.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_4a4 = uVar31;
      local_4a0 = uVar29;
      while (((0.001 < ABS(startx - goalx) || (0.001 < ABS(starty - goaly))) ||
             (0.001 < ABS(starttheta - goaltheta)))) {
        if (preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        if (changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
            super__Vector_impl_data._M_start) {
          changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
          super__Vector_impl_data._M_finish =
               changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        uVar20 = (long)sensecells.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)sensecells.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        if ((int)uVar20 < 1) {
          cVar14 = clock();
        }
        else {
          uVar21 = 0;
          local_5c0 = 0;
          do {
            iVar28 = size_x;
            if (uVar20 <= uVar21) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar21);
              goto LAB_001094db;
            }
            auVar35._8_8_ = starty;
            auVar35._0_8_ = startx;
            auVar37._8_8_ = cellsize_m;
            auVar37._0_8_ = cellsize_m;
            lStack_5d0 = -(ulong)(starty < 0.0);
            auVar35 = divpd(auVar35,auVar37);
            uVar29 = (sensecells.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar21].x - (uint)(startx < 0.0)) +
                     (int)auVar35._0_8_;
            iVar22 = sensecells.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar21].y + (int)lStack_5d0 +
                     (int)auVar35._8_8_;
            local_5d8.y = iVar22;
            local_5d8.x = uVar29;
            if (((-1 < (int)uVar29) && (pcVar30 = (char *)(ulong)(uint)size_x, (int)uVar29 < size_x)
                ) && ((-1 < iVar22 && (iVar22 < size_y)))) {
              cVar6 = EnvironmentNAVXYTHETALATTICE::GetMapCost
                                ((int)&trueenvironment_navxythetalat,uVar29);
              pcVar30 = (char *)(ulong)(uint)(iVar28 * iVar22);
              pcVar19 = pcVar30 + uVar29;
              if (*(char *)((long)__s + (long)pcVar19) != cVar6) {
                *(char *)((long)__s + (long)pcVar19) = cVar6;
                EnvironmentNAVXYTHETALATTICE::UpdateCost
                          ((int)&environment_navxythetalat,uVar29,(uchar)iVar22);
                iVar28 = printf("setting cost[%d][%d] to %d\n",uVar29,iVar22,
                                (ulong)*(byte *)((long)__s + (long)pcVar19));
                local_4b0 = local_5d8;
                if (changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  local_5c0 = CONCAT71((int7)(CONCAT44(extraout_var,iVar28) >> 8),1);
                  std::vector<sbpl_2Dcell_t,std::allocator<sbpl_2Dcell_t>>::
                  _M_realloc_insert<sbpl_2Dcell_t_const&>
                            ((vector<sbpl_2Dcell_t,std::allocator<sbpl_2Dcell_t>> *)&changedcellsV,
                             (iterator)
                             changedcellsV.
                             super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                             _M_impl.super__Vector_impl_data._M_finish,&local_4b0);
                }
                else {
                  *changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish = local_5d8;
                  changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       changedcellsV.
                       super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                  local_5c0 = CONCAT71(local_5d8._1_7_,1);
                }
              }
            }
            uVar21 = uVar21 + 1;
            uVar20 = (long)sensecells.
                           super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)sensecells.
                           super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3;
          } while ((long)uVar21 <
                   (long)(int)((ulong)((long)sensecells.
                                             super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)sensecells.
                                            super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3));
          cVar14 = clock();
          if ((local_5c0 & 1) != 0) {
            lVar17 = __dynamic_cast(this,&SBPLPlanner::typeinfo,&ARAPlanner::typeinfo);
            if (lVar17 == 0) {
              lVar17 = __dynamic_cast(this,&SBPLPlanner::typeinfo,&ADPlanner::typeinfo);
              if (lVar17 != 0) {
                EnvironmentNAVXYTHETALAT::GetPredsofChangedEdges
                          ((vector *)&environment_navxythetalat,(vector *)&changedcellsV);
                (**(code **)(*(long *)this + 0xb0))(this,&preds_of_changededgesIDV);
                printf("%d states were affected\n",
                       (ulong)((long)preds_of_changededgesIDV.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)preds_of_changededgesIDV.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2);
              }
            }
            else {
              (**(code **)(*(long *)this + 0xa8))(this);
            }
          }
        }
        local_52c = (int)(startx / cellsize_m) - (uint)(startx < 0.0);
        local_530 = (int)(starty / cellsize_m) - (uint)(starty < 0.0);
        local_49c = ContTheta2Disc(starttheta,num_thetas);
        puts("new planning...");
        local_5dc = (*(code *)**(undefined8 **)this)
                              (0x4024000000000000,this,(vector *)&solution_stateIDs_V);
        piVar3 = solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        piVar2 = solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (**(code **)(*(long *)this + 0x50))(this);
        printf("done with the solution of size=%d and sol. eps=%f\n",
               (ulong)((long)piVar3 - (long)piVar2) >> 2 & 0xffffffff);
        EnvironmentNAVXYTHETALATTICE::PrintTimeStat((_IO_FILE *)&environment_navxythetalat);
        cVar15 = clock();
        uVar38 = (**(code **)(*(long *)this + 0x50))(this);
        fprintf(__stream,"plan time=%.5f eps=%.2f\n",((double)cVar15 - (double)cVar14) / 1000000.0,
                uVar38);
        fflush(__stream);
        if (xythetaPath.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            xythetaPath.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          xythetaPath.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               xythetaPath.
               super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        EnvironmentNAVXYTHETALAT::ConvertStateIDPathintoXYThetaPath
                  ((vector *)&environment_navxythetalat,(vector *)&solution_stateIDs_V);
        printf("actual path (with intermediate poses) size=%d\n",
               (ulong)(uint)((int)((ulong)((long)xythetaPath.
                                                 super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)xythetaPath.
                                                super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                            -0x55555555));
        pcVar30 = "%.3f %.3f %.3f\n";
        if (xythetaPath.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            xythetaPath.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          uVar20 = 0;
          uVar21 = 1;
          do {
            fprintf(__stream,"%.3f %.3f %.3f\n",
                    *(undefined8 *)
                     (xythetaPath.
                      super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
                      _M_impl.super__Vector_impl_data._M_start + uVar20 * 0x18),
                    *(undefined8 *)
                     (xythetaPath.
                      super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
                      _M_impl.super__Vector_impl_data._M_start + uVar20 * 0x18 + 8),
                    *(undefined8 *)
                     (xythetaPath.
                      super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
                      _M_impl.super__Vector_impl_data._M_start + uVar20 * 0x18 + 0x10));
            uVar20 = ((long)xythetaPath.
                            super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)xythetaPath.
                            super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
            bVar32 = uVar21 <= uVar20;
            lVar17 = uVar20 - uVar21;
            uVar20 = uVar21;
            uVar21 = (ulong)((int)uVar21 + 1);
          } while (bVar32 && lVar17 != 0);
        }
        fwrite("*********\n",10,1,__stream);
        if (1 < (int)((ulong)((long)solution_stateIDs_V.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 2)) {
          lVar17 = 1;
          do {
            newtheta = 0;
            EnvironmentNAVXYTHETALAT::GetCoordFromState
                      ((int)&environment_navxythetalat,
                       (int *)(ulong)(uint)solution_stateIDs_V.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start[lVar17],&newx,&newy);
            fprintf(__stream,"%d %d %d\n",(ulong)(uint)newx,(ulong)(uint)newy,0);
            lVar17 = lVar17 + 1;
          } while (lVar17 < (int)((ulong)((long)solution_stateIDs_V.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                         (long)solution_stateIDs_V.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start) >> 2));
        }
        fflush(__stream);
        if (0 < size_y) {
          local_5d8.x = size_x * local_530 + local_52c;
          iVar28 = size_x * local_4a4 + local_4a0;
          iVar22 = 0;
          local_5c0 = CONCAT44(local_5c0._4_4_,iVar28);
          do {
            if (0 < size_x) {
              iVar27 = 0;
              do {
                iVar23 = size_x;
                uVar29 = EnvironmentNAVXYTHETALATTICE::GetMapCost
                                   ((int)&environment_navxythetalat,iVar27);
                iVar23 = iVar23 * iVar22 + iVar27;
                if ((int)((ulong)((long)solution_stateIDs_V.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                 (long)solution_stateIDs_V.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start) >> 2) < 2) {
                  bVar33 = iVar23 == iVar28;
                  bVar8 = 0;
                  bVar32 = iVar23 == local_5d8.x;
                  if ((bVar32) || (iVar23 == iVar28)) goto LAB_0010917f;
LAB_0010916b:
                  printf("%3d ",(ulong)uVar29 & 0xff);
                }
                else {
                  lVar17 = 1;
                  pcVar30 = (char *)0x0;
                  do {
                    newtheta = 0;
                    EnvironmentNAVXYTHETALAT::GetCoordFromState
                              ((int)&environment_navxythetalat,
                               (int *)(ulong)(uint)solution_stateIDs_V.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_start[lVar17],
                               &newx,&newy);
                    if (newy == iVar22 && newx == iVar27) {
                      pcVar30 = (char *)0x1;
                    }
                    lVar17 = lVar17 + 1;
                  } while (lVar17 < (int)((ulong)((long)solution_stateIDs_V.
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                 (long)solution_stateIDs_V.
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data._M_start) >>
                                         2));
                  bVar32 = iVar23 == local_5d8.x;
                  bVar33 = iVar23 == (int)local_5c0;
                  bVar8 = (!bVar32 && !bVar33) | (byte)pcVar30;
                  iVar28 = (int)local_5c0;
                  if ((!bVar32 && !bVar33) && (pcVar30 == (char *)0x0)) goto LAB_0010916b;
LAB_0010917f:
                  if (bVar32) {
                    pcVar19 = "  X ";
                  }
                  else if (bVar33) {
                    pcVar19 = "  G ";
                  }
                  else if (bVar8 == 0) {
                    pcVar19 = "? ";
                  }
                  else {
                    pcVar19 = "  * ";
                  }
                  printf(pcVar19);
                }
                iVar27 = iVar27 + 1;
              } while (iVar27 < size_x);
            }
            putchar(10);
            iVar22 = iVar22 + 1;
          } while (iVar22 < size_y);
        }
        if ((local_5dc == 1) &&
           (1 < (int)((ulong)((long)xythetaPath.
                                    super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)xythetaPath.
                                   super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555))
        {
          EnvironmentNAVXYTHETALAT::GetCoordFromState
                    ((int)&environment_navxythetalat,
                     (int *)(ulong)(uint)solution_stateIDs_V.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start[1],&newx,&newy);
          printf("moving from %d %d %d to %d %d %d\n",(ulong)local_52c,(ulong)local_530,
                 (ulong)local_49c,(ulong)(uint)newx,(ulong)(uint)newy);
          cVar6 = EnvironmentNAVXYTHETALATTICE::IsValidConfiguration
                            ((int)&trueenvironment_navxythetalat,newx,newy);
          if (cVar6 == '\0') goto LAB_001094ec;
          startx = (double)newx * cellsize_m + cellsize_m * 0.5;
          starty = (double)newy * cellsize_m + cellsize_m * 0.5;
          starttheta = (double)DiscTheta2Cont(newtheta,num_thetas);
          uVar9 = EnvironmentNAVXYTHETALAT::SetStart(startx,starty,starttheta);
          iVar28 = (**(code **)(*(long *)this + 0x28))(this,uVar9);
          if (iVar28 == 0) {
            prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (prVar16,"ERROR: failed to update robot pose in the planner");
            *(undefined ***)prVar16 = &PTR__runtime_error_0010ec48;
            __cxa_throw(prVar16,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        else {
          puts("No move is made");
        }
      }
      puts("goal reached!");
      fflush((FILE *)0x0);
      fclose(__stream);
      operator_delete__(__s);
      (**(code **)(*(long *)this + 0xa0))();
      if (xythetaPath.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(xythetaPath.
                        super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)xythetaPath.
                              super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)xythetaPath.
                              super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(changedcellsV.
                        super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)changedcellsV.
                              super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)changedcellsV.
                              super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (sensecells.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(sensecells.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)sensecells.
                              super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)sensecells.
                              super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      iVar28 = 1;
LAB_0010945b:
      if (solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>::~vector
                (&motionprimitiveV);
      if (perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)perimeterptsV.
                              super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)perimeterptsV.
                              super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      EnvironmentNAVXYTHETALAT::~EnvironmentNAVXYTHETALAT(&trueenvironment_navxythetalat);
      EnvironmentNAVXYTHETALAT::~EnvironmentNAVXYTHETALAT(&environment_navxythetalat);
      return iVar28;
    }
    prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar16,"ERROR: failed to set goal state");
  }
  *(undefined ***)prVar16 = &PTR__runtime_error_0010ec48;
  __cxa_throw(prVar16,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
LAB_001094db:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",pcVar30);
LAB_001094ec:
  prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (prVar16,
             "ERROR: robot is commanded to move into an invalid configuration according to true environment"
            );
  *(undefined ***)prVar16 = &PTR__runtime_error_0010ec48;
  __cxa_throw(prVar16,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int planandnavigatexythetalat(PlannerType plannerType, char* envCfgFilename, char* motPrimFilename, bool forwardSearch)
{
    double allocated_time_secs_foreachplan = 10.0; // in seconds
    double initialEpsilon = 3.0;
    bool bsearchuntilfirstsolution = false;
    bool bforwardsearch = forwardSearch;

    double goaltol_x = 0.001, goaltol_y = 0.001, goaltol_theta = 0.001;

    bool bPrint = false;
    bool bPrintMap = true;

    EnvironmentNAVXYTHETALAT environment_navxythetalat;
    EnvironmentNAVXYTHETALAT trueenvironment_navxythetalat;

    // set the perimeter of the robot
    // it is given with 0, 0, 0 robot ref. point for which planning is done.
    vector<sbpl_2Dpt_t> perimeterptsV;
    sbpl_2Dpt_t pt_m;
    double halfwidth = 0.01;
    double halflength = 0.01;
    pt_m.x = -halflength;
    pt_m.y = -halfwidth;
    perimeterptsV.push_back(pt_m);
    pt_m.x = halflength;
    pt_m.y = -halfwidth;
    perimeterptsV.push_back(pt_m);
    pt_m.x = halflength;
    pt_m.y = halfwidth;
    perimeterptsV.push_back(pt_m);
    pt_m.x = -halflength;
    pt_m.y = halfwidth;
    perimeterptsV.push_back(pt_m);

    //	perimeterptsV.clear();

    // initialize true map from the environment file without perimeter or motion primitives
    if (!trueenvironment_navxythetalat.InitializeEnv(envCfgFilename)) {
        throw SBPL_Exception("ERROR: InitializeEnv failed");
    }

    // environment parameters
    int size_x = -1, size_y = -1, num_thetas = -1;
    double startx = -1, starty = -1, starttheta = -1;
    double goalx = -1, goaly = -1, goaltheta = -1;
    double cellsize_m = 0.0, nominalvel_mpersecs = 0.0, timetoturn45degsinplace_secs = 0.0;
    unsigned char obsthresh = 0;
    vector<SBPL_xytheta_mprimitive> motionprimitiveV;

    // additional environment parameters
    unsigned char costinscribed_thresh = 0;
    unsigned char costcircum_thresh = 0;

    // get environment parameters from the true environment
    trueenvironment_navxythetalat.GetEnvParms(&size_x, &size_y, &num_thetas, &startx, &starty, &starttheta, &goalx,
                                              &goaly, &goaltheta, &cellsize_m, &nominalvel_mpersecs,
                                              &timetoturn45degsinplace_secs, &obsthresh, &motionprimitiveV);
    costinscribed_thresh = trueenvironment_navxythetalat.GetEnvParameter("cost_inscribed_thresh");
    costcircum_thresh = trueenvironment_navxythetalat.GetEnvParameter("cost_possibly_circumscribed_thresh");

    // print the map
    if (bPrintMap) {
        printf("true map:\n");
        for (int y = 0; y < size_y; y++) {
            for (int x = 0; x < size_x; x++) {
                printf("%3d ", trueenvironment_navxythetalat.GetMapCost(x, y));
            }
            printf("\n");
        }
        printf("System Pause (return=%d)\n", system("pause"));
    }

    // create an empty map
    unsigned char* map = new unsigned char[size_x * size_y];
    for (int i = 0; i < size_x * size_y; i++) {
        map[i] = 0;
    }

    // check the start and goal obtained from the true environment
    printf("start: %f %f %f, goal: %f %f %f\n", startx, starty, starttheta, goalx, goaly, goaltheta);

    // set robot environment parameters (should be done before initialize function is called)
    if (!environment_navxythetalat.SetEnvParameter("cost_inscribed_thresh", costinscribed_thresh)) {
        throw SBPL_Exception("ERROR: failed to set parameters");
    }
    if (!environment_navxythetalat.SetEnvParameter("cost_possibly_circumscribed_thresh", costcircum_thresh)) {
        throw SBPL_Exception("ERROR: failed to set parameters");
    }

    // initialize environment (should be called before initializing anything else)
    EnvNAVXYTHETALAT_InitParms params;
    params.startx = startx;
    params.starty = starty;
    params.starttheta = starttheta;
    params.goalx = goalx;
    params.goaly = goaly;
    params.goaltheta = goaltheta;
    params.goaltol_x = goaltol_x;
    params.goaltol_y = goaltol_y;
    params.goaltol_theta = goaltol_theta;
    params.mapdata = map;
    params.numThetas = num_thetas;

    bool envInitialized = environment_navxythetalat.InitializeEnv(size_x, size_y, perimeterptsV, cellsize_m,
                                                                  nominalvel_mpersecs, timetoturn45degsinplace_secs,
                                                                  obsthresh, motPrimFilename, params);

    if (!envInitialized) {
        throw SBPL_Exception("ERROR: InitializeEnv failed");
    }

    // set start and goal states
    environment_navxythetalat.SetStart(startx, starty, starttheta);
    environment_navxythetalat.SetGoal(goalx, goaly, goaltheta);

    MDPConfig MDPCfg;

    // initialize MDP info
    if (!environment_navxythetalat.InitializeMDPCfg(&MDPCfg)) {
        throw SBPL_Exception("ERROR: InitializeMDPCfg failed");
    }

    // create a planner
    vector<int> solution_stateIDs_V;

    SBPLPlanner* planner = NULL;
    switch (plannerType) {
    case PLANNER_TYPE_ARASTAR:
        printf("Initializing ARAPlanner...\n");
        planner = new ARAPlanner(&environment_navxythetalat, bforwardsearch);
        break;
    case PLANNER_TYPE_ADSTAR:
        printf("Initializing ADPlanner...\n");
        planner = new ADPlanner(&environment_navxythetalat, bforwardsearch);
        break;
    case PLANNER_TYPE_RSTAR:
        printf("Invalid configuration: xytheta environment does not support rstar planner...\n");
        return 0;
    case PLANNER_TYPE_ANASTAR:
        printf("Initializing anaPlanner...\n");
        planner = new anaPlanner(&environment_navxythetalat, bforwardsearch);
        break;
    default:
        printf("Invalid planner type\n");
        break;
    }

    // set the start and goal states for the planner and other search variables
    if (planner->set_start(MDPCfg.startstateid) == 0) {
        throw SBPL_Exception("ERROR: failed to set start state");
    }
    if (planner->set_goal(MDPCfg.goalstateid) == 0) {
        throw SBPL_Exception("ERROR: failed to set goal state");
    }
    planner->set_initialsolution_eps(initialEpsilon);
    planner->set_search_mode(bsearchuntilfirstsolution);

    // compute sensing as a square surrounding the robot with length twice that of the
    // longest motion primitive
    vector<sbpl_2Dcell_t> sensecells;
    double maxMotPrimLengthSquared = 0.0;
    double maxMotPrimLength = 0.0;
    const EnvNAVXYTHETALATConfig_t* cfg = environment_navxythetalat.GetEnvNavConfig();
    for (int i = 0; i < (int)cfg->mprimV.size(); i++) {
        const SBPL_xytheta_mprimitive& mprim = cfg->mprimV.at(i);
        int dx = mprim.endcell.x;
        int dy = mprim.endcell.y;
        if (dx * dx + dy * dy > maxMotPrimLengthSquared) {
            std::cout << "Found a longer motion primitive with dx = " << dx << " and dy = " << dy
                << " from starttheta = " << (int)mprim.starttheta_c << std::endl;
            maxMotPrimLengthSquared = dx * dx + dy * dy;
        }
    }
    maxMotPrimLength = sqrt((double)maxMotPrimLengthSquared);
    std::cout << "Maximum motion primitive length: " << maxMotPrimLength << std::endl;

    int sensingRange = (int)ceil(maxMotPrimLength);
    for (int x = -sensingRange; x <= sensingRange; x++) {
        for (int y = -sensingRange; y <= sensingRange; y++) {
            sensecells.push_back(sbpl_2Dcell_t(x, y));
        }
    }

    // create a file to hold the solution vector
    const char* sol = "sol.txt";
    FILE* fSol = fopen(sol, "w");
    if (fSol == NULL) {
        throw SBPL_Exception("ERROR: could not open solution file");
    }

    // print the goal pose
    int goalx_c = CONTXY2DISC(goalx, cellsize_m);
    int goaly_c = CONTXY2DISC(goaly, cellsize_m);
    int goaltheta_c = ContTheta2Disc(goaltheta, num_thetas);
    printf("goal_c: %d %d %d\n", goalx_c, goaly_c, goaltheta_c);

    vector<int> preds_of_changededgesIDV;
    vector<nav2dcell_t> changedcellsV;
    nav2dcell_t nav2dcell;
    vector<sbpl_xy_theta_pt_t> xythetaPath;

    // now comes the main loop
    while (fabs(startx - goalx) > goaltol_x || fabs(starty - goaly) > goaltol_y || fabs(starttheta - goaltheta)
        > goaltol_theta) {
        //simulate sensor data update
        bool bChanges = false;
        preds_of_changededgesIDV.clear();
        changedcellsV.clear();

        // simulate sensing the cells
        for (int i = 0; i < (int)sensecells.size(); i++) {
            int x = CONTXY2DISC(startx, cellsize_m) + sensecells.at(i).x;
            int y = CONTXY2DISC(starty, cellsize_m) + sensecells.at(i).y;

            // ignore if outside the map
            if (x < 0 || x >= size_x || y < 0 || y >= size_y) {
                continue;
            }

            int index = x + y * size_x;
            unsigned char truecost = trueenvironment_navxythetalat.GetMapCost(x, y);
            // update the cell if we haven't seen it before
            if (map[index] != truecost) {
                map[index] = truecost;
                environment_navxythetalat.UpdateCost(x, y, map[index]);
                printf("setting cost[%d][%d] to %d\n", x, y, map[index]);
                bChanges = true;
                // store the changed cells
                nav2dcell.x = x;
                nav2dcell.y = y;
                changedcellsV.push_back(nav2dcell);
            }
        }

        double TimeStarted = clock();

        // if necessary notify the planner of changes to costmap
        if (bChanges) {
            if (dynamic_cast<ARAPlanner*> (planner) != NULL) {
                ((ARAPlanner*)planner)->costs_changed(); //use by ARA* planner (non-incremental)
            }
            else if (dynamic_cast<ADPlanner*> (planner) != NULL) {
                // get the affected states
                environment_navxythetalat.GetPredsofChangedEdges(&changedcellsV, &preds_of_changededgesIDV);
                // let know the incremental planner about them
                //use by AD* planner (incremental)
                ((ADPlanner*)planner)->update_preds_of_changededges(&preds_of_changededgesIDV);
                printf("%d states were affected\n", (int)preds_of_changededgesIDV.size());
            }
        }

        int startx_c = CONTXY2DISC(startx, cellsize_m);
        int starty_c = CONTXY2DISC(starty, cellsize_m);
        int starttheta_c = ContTheta2Disc(starttheta, num_thetas);

        // plan a path
        bool bPlanExists = false;

        printf("new planning...\n");
        bPlanExists = (planner->replan(allocated_time_secs_foreachplan, &solution_stateIDs_V) == 1);
        printf("done with the solution of size=%d and sol. eps=%f\n", (unsigned int)solution_stateIDs_V.size(),
               planner->get_solution_eps());
        environment_navxythetalat.PrintTimeStat(stdout);

        // write the solution to sol.txt
        fprintf(fSol, "plan time=%.5f eps=%.2f\n", (clock() - TimeStarted) / ((double)CLOCKS_PER_SEC),
                planner->get_solution_eps());
        fflush(fSol);

        xythetaPath.clear();
        environment_navxythetalat.ConvertStateIDPathintoXYThetaPath(&solution_stateIDs_V, &xythetaPath);
        printf("actual path (with intermediate poses) size=%d\n", (unsigned int)xythetaPath.size());
        for (unsigned int i = 0; i < xythetaPath.size(); i++) {
            fprintf(fSol, "%.3f %.3f %.3f\n", xythetaPath.at(i).x, xythetaPath.at(i).y, xythetaPath.at(i).theta);
        }
        fprintf(fSol, "*********\n");

        for (int j = 1; j < (int)solution_stateIDs_V.size(); j++) {
            int newx, newy, newtheta = 0;
            environment_navxythetalat.GetCoordFromState(solution_stateIDs_V[j], newx, newy, newtheta);
            fprintf(fSol, "%d %d %d\n", newx, newy, newtheta);
        }
        fflush(fSol);

        // print the map (robot's view of the world and current plan)
        int startindex = startx_c + starty_c * size_x;
        int goalindex = goalx_c + goaly_c * size_x;
        for (int y = 0; bPrintMap && y < size_y; y++) {
            for (int x = 0; x < size_x; x++) {
                int index = x + y * size_x;
                int cost = map[index];
                cost = environment_navxythetalat.GetMapCost(x, y);

                // check to see if it is on the path
                bool bOnthePath = false;
                for (int j = 1; j < (int)solution_stateIDs_V.size(); j++) {
                    int newx, newy, newtheta = 0;
                    environment_navxythetalat.GetCoordFromState(solution_stateIDs_V[j], newx, newy, newtheta);
                    if (x == newx && y == newy) bOnthePath = true;
                }

                if (index != startindex && index != goalindex && !bOnthePath) {
                    printf("%3d ", cost);
                }
                else if (index == startindex) {
                    printf("  X ");
                }
                else if (index == goalindex) {
                    printf("  G ");
                }
                else if (bOnthePath) {
                    printf("  * ");
                }
                else {
                    printf("? ");
                }
            }
            printf("\n");
        }

        // move along the path
        if (bPlanExists && (int)xythetaPath.size() > 1) {
            //get coord of the successor
            int newx, newy, newtheta;

            // move until we move into the end of motion primitive
            environment_navxythetalat.GetCoordFromState(solution_stateIDs_V[1], newx, newy, newtheta);

            printf("moving from %d %d %d to %d %d %d\n", startx_c, starty_c, starttheta_c, newx, newy, newtheta);

            // this check is weak since true configuration does not know the actual perimeter of the robot
            if (!trueenvironment_navxythetalat.IsValidConfiguration(newx, newy, newtheta)) {
                throw SBPL_Exception("ERROR: robot is commanded to move into an invalid configuration according to true environment");
            }

            // move
            startx = DISCXY2CONT(newx, cellsize_m);
            starty = DISCXY2CONT(newy, cellsize_m);
            starttheta = DiscTheta2Cont(newtheta, num_thetas);

            // update the environment
            int newstartstateID = environment_navxythetalat.SetStart(startx, starty, starttheta);

            // update the planner
            if (planner->set_start(newstartstateID) == 0) {
                throw SBPL_Exception("ERROR: failed to update robot pose in the planner");
            }
        }
        else {
            printf("No move is made\n");
        }

        if (bPrint) {
            printf("System Pause (return=%d)\n", system("pause"));
        }
    }

    printf("goal reached!\n");

    fflush(NULL);
    fclose(fSol);

    delete[] map;
    delete planner;

    return 1;
}